

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

bool __thiscall
file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::read_file(file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_contents)

{
  int iVar1;
  IResultCapture *pIVar2;
  AssertionHandler local_a0;
  undefined **local_58;
  undefined1 local_50;
  undefined1 local_4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *local_40;
  undefined8 local_38;
  char *local_30;
  
  local_a0.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_a0.m_assertionInfo.macroName.m_size = 7;
  local_a0.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/tests.cpp";
  local_a0.m_assertionInfo.lineInfo.line = 0x48e;
  local_a0.m_assertionInfo.capturedExpression.m_start = "name == \"what\"";
  local_a0.m_assertionInfo.capturedExpression.m_size = 0xe;
  local_a0.m_assertionInfo.resultDisposition = Normal;
  local_a0.m_reaction.shouldDebugBreak = false;
  local_a0.m_reaction.shouldThrow = false;
  local_a0.m_completed = false;
  pIVar2 = Catch::getResultCapture();
  local_a0.m_resultCapture = pIVar2;
  iVar1 = std::__cxx11::string::compare((char *)name);
  local_4f = iVar1 == 0;
  local_50 = 1;
  local_58 = &PTR_streamReconstructedExpression_002421e0;
  local_40 = "==";
  local_38 = 2;
  local_30 = "what";
  local_48 = name;
  (*pIVar2->_vptr_IResultCapture[10])(pIVar2,&local_a0,&local_58,&local_a0.m_reaction);
  Catch::AssertionHandler::complete(&local_a0);
  if (local_a0.m_completed == false) {
    (*(local_a0.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::__cxx11::string::_M_replace
            ((ulong)file_contents,0,(char *)file_contents->_M_string_length,0x20a227);
  return true;
}

Assistant:

bool read_file(const string_type& name, string_type& file_contents) const {
        // read from file [name].mustache (fake the data for the test)
        REQUIRE(name == "what");
        file_contents = "World";
        return true;
    }